

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview_p.h
# Opt level: O3

void __thiscall
QAbstractItemViewPrivate::paintDropIndicator(QAbstractItemViewPrivate *this,QPainter *painter)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QStyle *pQVar5;
  long in_FS_OFFSET;
  int iVar7;
  undefined1 auVar6 [16];
  QStyleOption opt;
  undefined1 local_78 [16];
  undefined1 *local_68;
  undefined1 *puStack_60;
  QWidgetData *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->showDropIndicator == true) && (this->state == DraggingState)) &&
     (uVar1 = (this->dropIndicatorRect).x1, uVar3 = (this->dropIndicatorRect).y1,
     uVar2 = (this->dropIndicatorRect).x2, uVar4 = (this->dropIndicatorRect).y2,
     auVar6._0_4_ = -(uint)(uVar2 == uVar1 + -1), iVar7 = -(uint)(uVar4 == uVar3 + -1),
     auVar6._4_4_ = auVar6._0_4_, auVar6._8_4_ = iVar7, auVar6._12_4_ = iVar7,
     iVar7 = movmskpd((int)local_30,auVar6), iVar7 != 3)) {
    QWidget::cursor((QWidget *)local_78);
    iVar7 = QCursor::shape();
    QCursor::~QCursor((QCursor *)local_78);
    if (iVar7 != 0xe) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
      pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOption::QStyleOption((QStyleOption *)local_78,1,0);
      QStyleOption::initFrom
                ((QStyleOption *)local_78,
                 *(QWidget **)
                  &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate
                   .field_0x8);
      local_68._0_4_ = (this->dropIndicatorRect).x1.m_i;
      local_68._4_4_ = (this->dropIndicatorRect).y1.m_i;
      puStack_60._0_4_ = (this->dropIndicatorRect).x2.m_i;
      puStack_60._4_4_ = (this->dropIndicatorRect).y2.m_i;
      pQVar5 = QWidget::style(*(QWidget **)
                               &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                                super_QWidgetPrivate.field_0x8);
      (**(code **)(*(long *)pQVar5 + 0xb0))
                (pQVar5,0x2b,local_78,painter,
                 *(undefined8 *)
                  &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate
                   .field_0x8);
      QStyleOption::~QStyleOption((QStyleOption *)local_78);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void paintDropIndicator(QPainter *painter)
    {
        if (showDropIndicator && state == QAbstractItemView::DraggingState
            && !dropIndicatorRect.isNull()
#ifndef QT_NO_CURSOR
            && viewport->cursor().shape() != Qt::ForbiddenCursor
#endif
        ) {
            QStyleOption opt;
            opt.initFrom(q_func());
            opt.rect = dropIndicatorRect;
            q_func()->style()->drawPrimitive(QStyle::PE_IndicatorItemViewItemDrop, &opt, painter, q_func());
        }
    }